

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_table_record(PSH_Hint_Table table,FT_UInt idx)

{
  uint uVar1;
  uint uVar2;
  PSH_Hint_conflict *ppPVar3;
  PSH_Hint pPVar4;
  PSH_Hint_conflict pPVar5;
  long lVar6;
  
  uVar1 = table->max_hints;
  if (idx < uVar1) {
    pPVar5 = table->hints + idx;
    if ((pPVar5->flags & 4) == 0) {
      pPVar5->flags = pPVar5->flags | 4;
      ppPVar3 = table->sort_global;
      uVar2 = table->num_hints;
      pPVar5->parent = (PSH_Hint)0x0;
      for (lVar6 = 0; uVar2 != (uint)lVar6; lVar6 = lVar6 + 1) {
        pPVar4 = ppPVar3[lVar6];
        if ((pPVar4->org_pos <= pPVar5->org_len + pPVar5->org_pos) &&
           (pPVar5->org_pos <= pPVar4->org_pos + pPVar4->org_len)) {
          pPVar5->parent = pPVar4;
          break;
        }
      }
      if (uVar2 < uVar1) {
        table->num_hints = uVar2 + 1;
        ppPVar3[uVar2] = pPVar5;
      }
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_record( PSH_Hint_Table  table,
                         FT_UInt         idx )
  {
    PSH_Hint  hint = table->hints + idx;


    if ( idx >= table->max_hints )
    {
      FT_TRACE0(( "psh_hint_table_record: invalid hint index %d\n", idx ));
      return;
    }

    /* ignore active hints */
    if ( psh_hint_is_active( hint ) )
      return;

    psh_hint_activate( hint );

    /* now scan the current active hint set to check */
    /* whether `hint' overlaps with another hint     */
    {
      PSH_Hint*  sorted = table->sort_global;
      FT_UInt    count  = table->num_hints;
      PSH_Hint   hint2;


      hint->parent = NULL;
      for ( ; count > 0; count--, sorted++ )
      {
        hint2 = sorted[0];

        if ( psh_hint_overlap( hint, hint2 ) )
        {
          hint->parent = hint2;
          break;
        }
      }
    }

    if ( table->num_hints < table->max_hints )
      table->sort_global[table->num_hints++] = hint;
    else
      FT_TRACE0(( "psh_hint_table_record: too many sorted hints!  BUG!\n" ));
  }